

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse.c
# Opt level: O3

void heapify(VecPNode *a,uint i)

{
  uint uVar1;
  PNode **ppPVar2;
  PNode *pPVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  
  uVar1 = a->n;
  if (uVar1 != 0) {
    while( true ) {
      uVar6 = i * 2 + 1;
      uVar4 = i;
      if ((uVar6 < uVar1) && (uVar4 = uVar6, a->v[uVar6]->height <= a->v[i]->height)) {
        uVar4 = i;
      }
      uVar6 = i * 2 + 2;
      uVar5 = uVar4;
      if ((uVar6 < uVar1) && (uVar5 = uVar6, a->v[uVar6]->height <= a->v[uVar4]->height)) {
        uVar5 = uVar4;
      }
      if (uVar5 == i) break;
      ppPVar2 = a->v;
      pPVar3 = ppPVar2[uVar5];
      ppPVar2[uVar5] = ppPVar2[i];
      a->v[i] = pPVar3;
      i = uVar5;
    }
  }
  return;
}

Assistant:

void heapify(VecPNode *a, uint i) {
  if (a->n >= 1) {
    uint largest = i;
    uint l = 2 * i + 1;
    uint r = 2 * i + 2;
    if (l < a->n && a->v[l]->height > a->v[largest]->height)
      largest = l;
    if (r < a->n && a->v[r]->height > a->v[largest]->height)
      largest = r;
    if (largest != i) {
      PNode *temp = a->v[largest];
      a->v[largest] = a->v[i];
      a->v[i] = temp;
      heapify(a, largest);
    }
  }
}